

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O0

void __thiscall pmx::PmxVertex::Read(PmxVertex *this,istream *stream,PmxSetting *setting)

{
  undefined8 *puVar1;
  pointer pPVar2;
  unique_ptr<pmx::PmxVertexSkinningQDEF,_std::default_delete<pmx::PmxVertexSkinningQDEF>_> local_50;
  unique_ptr<pmx::PmxVertexSkinningSDEF,_std::default_delete<pmx::PmxVertexSkinningSDEF>_> local_48;
  unique_ptr<pmx::PmxVertexSkinningBDEF4,_std::default_delete<pmx::PmxVertexSkinningBDEF4>_>
  local_40;
  unique_ptr<pmx::PmxVertexSkinningBDEF2,_std::default_delete<pmx::PmxVertexSkinningBDEF2>_>
  local_38;
  unique_ptr<pmx::PmxVertexSkinningBDEF1,_std::default_delete<pmx::PmxVertexSkinningBDEF1>_>
  local_30;
  int local_24;
  PmxSetting *pPStack_20;
  int i;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxVertex *this_local;
  
  pPStack_20 = setting;
  setting_local = (PmxSetting *)stream;
  stream_local = (istream *)this;
  std::istream::read((char *)stream,(long)this);
  std::istream::read((char *)setting_local,(long)this->normal);
  std::istream::read((char *)setting_local,(long)this->uv);
  for (local_24 = 0; local_24 < (int)(uint)pPStack_20->uv; local_24 = local_24 + 1) {
    std::istream::read((char *)setting_local,(long)(this->uva + local_24));
  }
  std::istream::read((char *)setting_local,(long)&this->skinning_type);
  switch(this->skinning_type) {
  case BDEF1:
    std::make_unique<pmx::PmxVertexSkinningBDEF1>();
    std::unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>>::operator=
              ((unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>> *)
               &this->skinning,&local_30);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF1,_std::default_delete<pmx::PmxVertexSkinningBDEF1>_>
    ::~unique_ptr(&local_30);
    break;
  case BDEF2:
    std::make_unique<pmx::PmxVertexSkinningBDEF2>();
    std::unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>>::operator=
              ((unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>> *)
               &this->skinning,&local_38);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF2,_std::default_delete<pmx::PmxVertexSkinningBDEF2>_>
    ::~unique_ptr(&local_38);
    break;
  case BDEF4:
    std::make_unique<pmx::PmxVertexSkinningBDEF4>();
    std::unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>>::operator=
              ((unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>> *)
               &this->skinning,&local_40);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF4,_std::default_delete<pmx::PmxVertexSkinningBDEF4>_>
    ::~unique_ptr(&local_40);
    break;
  case SDEF:
    std::make_unique<pmx::PmxVertexSkinningSDEF>();
    std::unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>>::operator=
              ((unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>> *)
               &this->skinning,&local_48);
    std::unique_ptr<pmx::PmxVertexSkinningSDEF,_std::default_delete<pmx::PmxVertexSkinningSDEF>_>::
    ~unique_ptr(&local_48);
    break;
  case QDEF:
    std::make_unique<pmx::PmxVertexSkinningQDEF>();
    std::unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>>::operator=
              ((unique_ptr<pmx::PmxVertexSkinning,std::default_delete<pmx::PmxVertexSkinning>> *)
               &this->skinning,&local_50);
    std::unique_ptr<pmx::PmxVertexSkinningQDEF,_std::default_delete<pmx::PmxVertexSkinningQDEF>_>::
    ~unique_ptr(&local_50);
    break;
  default:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "invalid skinning type";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  pPVar2 = std::unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
           operator->(&this->skinning);
  (**pPVar2->_vptr_PmxVertexSkinning)(pPVar2,setting_local,pPStack_20);
  std::istream::read((char *)setting_local,(long)&this->edge);
  return;
}

Assistant:

void PmxVertex::Read(std::istream *stream, PmxSetting *setting)
	{
		stream->read((char*) this->positon, sizeof(float) * 3);
		stream->read((char*) this->normal, sizeof(float) * 3);
		stream->read((char*) this->uv, sizeof(float) * 2);
		for (int i = 0; i < setting->uv; ++i)
		{
			stream->read((char*) this->uva[i], sizeof(float) * 4);
		}
		stream->read((char*) &this->skinning_type, sizeof(PmxVertexSkinningType));
		switch (this->skinning_type)
		{
		case PmxVertexSkinningType::BDEF1:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF1>();
			break;
		case PmxVertexSkinningType::BDEF2:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF2>();
			break;
		case PmxVertexSkinningType::BDEF4:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF4>();
			break;
		case PmxVertexSkinningType::SDEF:
			this->skinning = std::make_unique<PmxVertexSkinningSDEF>();
			break;
		case PmxVertexSkinningType::QDEF:
			this->skinning = std::make_unique<PmxVertexSkinningQDEF>();
			break;
		default:
			throw "invalid skinning type";
		}
		this->skinning->Read(stream, setting);
		stream->read((char*) &this->edge, sizeof(float));
	}